

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Vector3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Vector3f v,Float time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  float x;
  Vector3f VVar8;
  Vector3f VVar9;
  Transform t;
  Transform local_88;
  
  auVar6._4_60_ = v._12_60_;
  auVar6._0_4_ = v.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._8_56_ = v._8_56_;
  auVar3._0_8_ = v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5 = auVar6._0_16_;
  auVar1 = auVar3._0_16_;
  if ((this->actuallyAnimated != true) || (time <= this->startTime)) {
    auVar2 = vmovshdup_avx(auVar1);
    fVar4 = auVar2._0_4_;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->startTransform).m.m[0][1])),auVar1,
                             ZEXT416((uint)(this->startTransform).m.m[0][0]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->startTransform).m.m[1][1])),auVar1,
                             ZEXT416((uint)(this->startTransform).m.m[1][0]));
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->startTransform).m.m[2][1])),auVar1,
                             ZEXT416((uint)(this->startTransform).m.m[2][0]));
    auVar2 = vfmadd231ss_fma(auVar2,auVar5,ZEXT416((uint)(this->startTransform).m.m[0][2]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar5,ZEXT416((uint)(this->startTransform).m.m[1][2]));
    auVar1 = vfmadd231ss_fma(auVar1,auVar5,ZEXT416((uint)(this->startTransform).m.m[2][2]));
    fVar4 = auVar1._0_4_;
  }
  else {
    if (time < this->endTime) {
      Interpolate(&local_88,this,time);
      auVar5 = vmovshdup_avx(auVar1);
      fVar4 = auVar5._0_4_;
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_88.m.m[0][1])),auVar1,
                               ZEXT416((uint)local_88.m.m[0][0]));
      auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_88.m.m[1][1])),auVar1,
                               ZEXT416((uint)local_88.m.m[1][0]));
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_88.m.m[2][1])),auVar1,
                               ZEXT416((uint)local_88.m.m[2][0]));
      auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)auVar6._0_4_),ZEXT416((uint)local_88.m.m[0][2]))
      ;
      auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)auVar6._0_4_),ZEXT416((uint)local_88.m.m[1][2]))
      ;
      auVar7 = vfmadd231ss_fma(auVar1,ZEXT416((uint)auVar6._0_4_),ZEXT416((uint)local_88.m.m[2][2]))
      ;
      auVar1 = vinsertps_avx(auVar5,auVar2,0x10);
      VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar1._0_8_;
      VVar8.super_Tuple3<pbrt::Vector3,_float>.z = auVar7._0_4_;
      return (Vector3f)VVar8.super_Tuple3<pbrt::Vector3,_float>;
    }
    auVar2 = vmovshdup_avx(auVar1);
    fVar4 = auVar2._0_4_;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->endTransform).m.m[0][1])),auVar1,
                             ZEXT416((uint)(this->endTransform).m.m[0][0]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->endTransform).m.m[1][1])),auVar1,
                             ZEXT416((uint)(this->endTransform).m.m[1][0]));
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->endTransform).m.m[2][1])),auVar1,
                             ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar2 = vfmadd231ss_fma(auVar2,auVar5,ZEXT416((uint)(this->endTransform).m.m[0][2]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar5,ZEXT416((uint)(this->endTransform).m.m[1][2]));
    auVar1 = vfmadd231ss_fma(auVar1,auVar5,ZEXT416((uint)(this->endTransform).m.m[2][2]));
    fVar4 = auVar1._0_4_;
  }
  auVar1 = vinsertps_avx(auVar2,auVar7,0x10);
  VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar1._0_8_;
  VVar9.super_Tuple3<pbrt::Vector3,_float>.z = fVar4;
  return (Vector3f)VVar9.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f AnimatedTransform::operator()(Vector3f v, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(v);
    else if (time >= endTime)
        return endTransform(v);
    Transform t = Interpolate(time);
    return t(v);
}